

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stun_msg.c
# Opt level: O2

void stun_attr_errcode_init(stun_attr_errcode *attr,int err_code,char *err_reason,uint8_t pad)

{
  size_t sVar1;
  uint uVar2;
  
  sVar1 = strlen(err_reason);
  uVar2 = (int)sVar1 + 4;
  (attr->hdr).type = 0x900;
  (attr->hdr).length = (ushort)uVar2 << 8 | (ushort)uVar2 >> 8;
  attr->unused = 0;
  attr->err_class = (uint8_t)(err_code / 100);
  attr->err_code = (uint8_t)(err_code % 100);
  memcpy(attr->err_reason,err_reason,(long)(int)sVar1);
  if ((uVar2 & 3) != 0) {
    memset(attr->err_reason + ((ulong)(uVar2 & 0xffff) - 4),(uint)pad,
           4 - ((ulong)(uVar2 & 0xffff) & 3));
    return;
  }
  return;
}

Assistant:

void stun_attr_errcode_init(stun_attr_errcode *attr, int err_code,
                            const char *err_reason, uint8_t pad) {
  int reason_len = strlen(err_reason);
  uint8_t *p = (uint8_t *)attr;
  uint16_t attr_len = (uint16_t)(sizeof(attr->unused)
      + sizeof(attr->err_class) + sizeof(attr->err_code) + reason_len);
  stun_attr_hdr_init(&attr->hdr, STUN_ATTR_ERROR_CODE, attr_len);
  attr->unused = 0;
  attr->err_class = (uint8_t)(err_code / 100);
  attr->err_code = err_code % 100;
  memcpy(attr->err_reason, err_reason, reason_len);
  store_padding(p + sizeof(attr->hdr) + attr_len, attr_len, pad);
}